

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall
crnd::crn_unpacker::unpack_dxt5a
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  vector<crnd::crn_unpacker::block_buffer_element> *this_01;
  uint uVar1;
  unsigned_short *puVar2;
  bool bVar3;
  byte bVar4;
  uint32 uVar5;
  crn_header *pcVar6;
  uint uVar7;
  ulong uVar8;
  uint32 x;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  block_buffer_element *pbVar13;
  uint uVar14;
  uint8 *puVar15;
  uint min_new_capacity;
  
  uVar1 = (this->m_alpha_endpoints).m_size;
  uVar12 = (this->m_block_buffer).m_size;
  min_new_capacity = output_width + 1 & 0xfffffffe;
  this_01 = &this->m_block_buffer;
  if (uVar12 < min_new_capacity) {
    if ((this->m_block_buffer).m_capacity < min_new_capacity) {
      bVar3 = elemental_vector::increase_capacity
                        ((elemental_vector *)this_01,min_new_capacity,uVar12 + 1 == min_new_capacity
                         ,8,(object_mover)0x0);
      if (!bVar3) {
        (this->m_block_buffer).m_alloc_failed = true;
        goto LAB_00114972;
      }
    }
    (this->m_block_buffer).m_size = min_new_capacity;
  }
LAB_00114972:
  pcVar6 = this->m_pHeader;
  if ((pcVar6->m_faces).m_buf[0] != '\0') {
    uVar7 = output_height + 1 & 0xfffffffe;
    this_00 = &this->m_codec;
    uVar8 = 0;
    uVar12 = 0;
    uVar11 = 0;
    do {
      if (uVar7 != 0) {
        puVar15 = pDst[uVar8];
        uVar14 = 0;
        do {
          if (min_new_capacity != 0) {
            bVar3 = uVar14 < output_height;
            uVar9 = 0;
            do {
              uVar10 = (uint)uVar11;
              if (((uVar14 | (uint)uVar9) & 1) == 0) {
                uVar5 = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
                uVar11 = (ulong)uVar5;
                pbVar13 = this_01->m_p + uVar9;
LAB_00114a74:
                bVar4 = (byte)uVar11 & 3;
                pbVar13->endpoint_reference = (ushort)((byte)(uVar11 >> 2) & 3);
                uVar10 = (uint)(uVar11 >> 4) & 0xf;
              }
              else {
                pbVar13 = this_01->m_p + uVar9;
                if ((uVar14 & 1) == 0) goto LAB_00114a74;
                bVar4 = (byte)pbVar13->endpoint_reference;
              }
              uVar11 = (ulong)uVar10;
              if (bVar4 == 1) {
                pbVar13->alpha0_endpoint_index = (uint16)uVar12;
              }
              else if (bVar4 == 0) {
                uVar5 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
                uVar10 = uVar1;
                if (uVar5 + uVar12 < uVar1) {
                  uVar10 = 0;
                }
                uVar12 = (uVar5 + uVar12) - uVar10;
                pbVar13->alpha0_endpoint_index = (uint16)uVar12;
              }
              else {
                uVar12 = (uint)pbVar13->alpha0_endpoint_index;
              }
              bVar3 = (bool)(bVar3 & uVar9 < output_width);
              uVar5 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
              if (bVar3) {
                puVar2 = (this->m_alpha_selectors).m_p;
                *(uint *)puVar15 = CONCAT22(puVar2[uVar5 * 3],(this->m_alpha_endpoints).m_p[uVar12])
                ;
                *(undefined4 *)(puVar15 + 4) = *(undefined4 *)(puVar2 + (ulong)(uVar5 * 3) + 1);
              }
              uVar9 = uVar9 + 1;
              puVar15 = puVar15 + 8;
            } while (uVar9 != min_new_capacity);
          }
          uVar14 = uVar14 + 1;
          puVar15 = puVar15 + (long)(int)((row_pitch_in_bytes >> 2) + min_new_capacity * -2) * 4;
        } while (uVar14 != uVar7);
        pcVar6 = this->m_pHeader;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (pcVar6->m_faces).m_buf[0]);
  }
  return true;
}

Assistant:

bool unpack_dxt5a(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
    const uint32 width = output_width + 1 & ~1;
    const uint32 height = output_height + 1 & ~1;
    const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 1);

    if (m_block_buffer.size() < width)
      m_block_buffer.resize(width);

    uint32 alpha0_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 2) {
          visible = visible && x < output_width;
          if (!(y & 1) && !(x & 1))
            reference_group = m_codec.decode(m_reference_encoding_dm);
          block_buffer_element &buffer = m_block_buffer[x];
          uint8 endpoint_reference;
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            endpoint_reference = reference_group & 3;
            reference_group >>= 2;
            buffer.endpoint_reference = reference_group & 3;
            reference_group >>= 2;
          }
          if (!endpoint_reference) {
            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
            if (alpha0_endpoint_index >= num_alpha_endpoints)
              alpha0_endpoint_index -= num_alpha_endpoints;
            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
          } else if (endpoint_reference == 1) {
            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
          } else {
            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
          }
          uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
          if (visible) {
            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
          }
        }
      }
    }
    return true;
  }